

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O0

aom_codec_err_t
av1_check_initial_width(AV1_COMP *cpi,int use_highbitdepth,int subsampling_x,int subsampling_y)

{
  SequenceHeader *pSVar1;
  _Bool _Var2;
  int iVar3;
  int in_ECX;
  int in_EDX;
  uint in_ESI;
  AV1_COMP *in_RDI;
  AV1_COMP *unaff_retaddr;
  SequenceHeader *seq_params;
  AV1_COMMON *cm;
  undefined4 in_stack_00000018;
  AV1_COMMON *pAVar4;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_fffffffffffffffc;
  
  pAVar4 = &in_RDI->common;
  pSVar1 = (in_RDI->common).seq_params;
  if (((((in_RDI->frame_size_related_setup_done & 1U) == 0) || (pSVar1->use_highbitdepth != in_ESI))
      || (pSVar1->subsampling_x != in_EDX)) || (pSVar1->subsampling_y != in_ECX)) {
    pSVar1->subsampling_x = in_EDX;
    pSVar1->subsampling_y = in_ECX;
    pSVar1->use_highbitdepth = (uint8_t)in_ESI;
    av1_set_speed_features_framesize_independent(unaff_retaddr,in_stack_fffffffffffffffc);
    av1_set_speed_features_framesize_dependent
              ((AV1_COMP *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),(int)((ulong)pAVar4 >> 0x20));
    iVar3 = is_stat_generation_stage(in_RDI);
    if ((iVar3 == 0) &&
       (_Var2 = av1_tf_info_alloc((TEMPORAL_FILTER_INFO *)CONCAT44(use_highbitdepth,subsampling_x),
                                  (AV1_COMP *)CONCAT44(subsampling_y,in_stack_00000018)), !_Var2)) {
      return AOM_CODEC_MEM_ERROR;
    }
    init_ref_frame_bufs(in_RDI);
    init_motion_estimation(unaff_retaddr);
    in_RDI->initial_mbs = (pAVar4->mi_params).MBs;
    in_RDI->frame_size_related_setup_done = true;
  }
  return AOM_CODEC_OK;
}

Assistant:

aom_codec_err_t av1_check_initial_width(AV1_COMP *cpi, int use_highbitdepth,
                                        int subsampling_x, int subsampling_y) {
  AV1_COMMON *const cm = &cpi->common;
  SequenceHeader *const seq_params = cm->seq_params;

  if (!cpi->frame_size_related_setup_done ||
      seq_params->use_highbitdepth != use_highbitdepth ||
      seq_params->subsampling_x != subsampling_x ||
      seq_params->subsampling_y != subsampling_y) {
    seq_params->subsampling_x = subsampling_x;
    seq_params->subsampling_y = subsampling_y;
    seq_params->use_highbitdepth = use_highbitdepth;

    av1_set_speed_features_framesize_independent(cpi, cpi->oxcf.speed);
    av1_set_speed_features_framesize_dependent(cpi, cpi->oxcf.speed);

    if (!is_stat_generation_stage(cpi)) {
#if !CONFIG_REALTIME_ONLY
      if (!av1_tf_info_alloc(&cpi->ppi->tf_info, cpi))
        return AOM_CODEC_MEM_ERROR;
#endif  // !CONFIG_REALTIME_ONLY
    }
    init_ref_frame_bufs(cpi);

    init_motion_estimation(cpi);  // TODO(agrange) This can be removed.

    cpi->initial_mbs = cm->mi_params.MBs;
    cpi->frame_size_related_setup_done = true;
  }
  return AOM_CODEC_OK;
}